

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool __thiscall
bloaty::RangeSink::IsVerboseForFileRange(RangeSink *this,uint64_t fileoff,uint64_t filesize)

{
  anon_class_16_2_11129c5a func;
  string_view format;
  bool bVar1;
  long in_RDX;
  ulong in_RSI;
  Arg *in_RDI;
  bool contains;
  RangeMap file_map;
  RangeMap vm_map;
  char *in_stack_fffffffffffffe68;
  int line;
  Arg *in_stack_fffffffffffffe70;
  uint64_t in_stack_fffffffffffffe78;
  RangeSink *in_stack_fffffffffffffe80;
  RangeSink *in_stack_fffffffffffffe88;
  allocator<char> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  RangeMap *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  uint64_t in_stack_fffffffffffffec0;
  uint64_t in_stack_fffffffffffffec8;
  RangeMap *in_stack_fffffffffffffed0;
  RangeMap *in_stack_fffffffffffffee0;
  Arg local_40;
  byte local_1;
  
  local_40.scratch_._16_8_ = in_RDX;
  if (in_RDX == -1) {
    local_40.scratch_._16_8_ = -1 - in_RSI;
  }
  if (in_RSI <= in_RSI + local_40.scratch_._16_8_) {
    bVar1 = ContainsVerboseFileOffset
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                       (uint64_t)in_stack_fffffffffffffe70);
    if (bVar1) {
      local_1 = 1;
    }
    else if ((in_RDI[5].piece_._M_len == 0) ||
            (bVar1 = Options::has_debug_vmaddr((Options *)0x1974dd), !bVar1)) {
      local_1 = 0;
    }
    else {
      RangeMap::RangeMap((RangeMap *)0x1974f3);
      RangeMap::RangeMap((RangeMap *)0x197500);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffea0,(char *)in_RDI,in_stack_fffffffffffffe90);
      RangeMap::AddRangeWithTranslation
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,(bool)in_stack_fffffffffffffeaf
                 ,in_stack_fffffffffffffee0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
      func.contains = (bool *)in_stack_fffffffffffffe90;
      func.this = in_stack_fffffffffffffe88;
      RangeMap::
      ForEachRange<bloaty::RangeSink::IsVerboseForFileRange(unsigned_long,unsigned_long)::__0>
                ((RangeMap *)in_stack_fffffffffffffe80,func);
      local_1 = 0;
      RangeMap::~RangeMap((RangeMap *)0x1975e9);
      RangeMap::~RangeMap((RangeMap *)0x1975f6);
    }
    return (bool)(local_1 & 1);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&in_stack_fffffffffffffe70->piece_,in_stack_fffffffffffffe68);
  absl::substitute_internal::Arg::Arg
            (in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
  absl::substitute_internal::Arg::Arg
            (in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
  line = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  format._M_str._0_7_ = in_stack_fffffffffffffea8;
  format._M_len = (size_t)in_stack_fffffffffffffea0;
  format._M_str._7_1_ = in_stack_fffffffffffffeaf;
  absl::Substitute_abi_cxx11_(format,in_RDI,&local_40);
  std::__cxx11::string::c_str();
  Throw((char *)in_stack_fffffffffffffe70,line);
}

Assistant:

bool RangeSink::IsVerboseForFileRange(uint64_t fileoff, uint64_t filesize) {
  if (filesize == RangeMap::kUnknownSize) {
    filesize = UINT64_MAX - fileoff;
  }

  if (fileoff + filesize < fileoff) {
    THROWF("Overflow in file range, fileoff=$0, filesize=$1", fileoff,
           filesize);
  }

  if (ContainsVerboseFileOffset(fileoff, filesize)) {
    return true;
  }

  if (translator_ && options_.has_debug_vmaddr()) {
    RangeMap vm_map;
    RangeMap file_map;
    bool contains = false;
    file_map.AddRangeWithTranslation(fileoff, filesize, "",
                                     translator_->file_map, false, &vm_map);
    vm_map.ForEachRange([this, &contains](uint64_t vmaddr, uint64_t vmsize) {
      if (ContainsVerboseVMAddr(vmaddr, vmsize)) {
        contains = true;
      }
    });
    return contains;
  }

  return false;
}